

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_scanner_tokenAsCharacter(sysbvm_context_t *context,size_t stringSize,uint8_t *string)

{
  uint uVar1;
  
  if (stringSize < 2) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/scanner.c:72: assertion failure: stringSize >= 2"
              );
  }
  else {
    if (stringSize == 2) {
      return 8;
    }
    if ((3 < stringSize) && (string[1] == '\\')) {
      uVar1 = (uint)string[2];
      if (uVar1 == 0x6e) {
        return 0xa8;
      }
      if (uVar1 == 0x74) {
        return 0x98;
      }
      if (string[2] == 0x72) {
        return 0xd8;
      }
      goto LAB_0013140a;
    }
  }
  uVar1 = (uint)string[1];
LAB_0013140a:
  return (ulong)(uVar1 << 4) | 8;
}

Assistant:

static sysbvm_tuple_t sysbvm_scanner_tokenAsCharacter(sysbvm_context_t *context, size_t stringSize, const uint8_t *string)
{
    SYSBVM_ASSERT(stringSize >= 2);
    if(stringSize == 2)
    {
        return sysbvm_tuple_char32_encode(context, 0);
    }
    else if(stringSize >= 4 && string[1] == '\\')
    {
        switch(string[2])
        {
        case 't': return sysbvm_tuple_char32_encode(context, '\t');
        case 'r': return sysbvm_tuple_char32_encode(context, '\r');
        case 'n': return sysbvm_tuple_char32_encode(context, '\n');
        default: return sysbvm_tuple_char32_encode(context, string[2]);
        }
    }
    else
    {
        return sysbvm_tuple_char32_encode(context, string[1]);
    }
}